

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O0

void __thiscall PcodeBuilder::build(PcodeBuilder *this,ConstructTpl *construct,int4 secnum)

{
  bool bVar1;
  uint4 uVar2;
  OpCode OVar3;
  UnimplError *this_00;
  reference ppOVar4;
  __normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_> local_88;
  OpTpl **local_80;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *local_78;
  vector<OpTpl_*,_std::allocator<OpTpl_*>_> *ops;
  OpTpl *op;
  const_iterator iter;
  uint4 oldbase;
  allocator local_41;
  string local_40 [36];
  uint local_1c;
  ConstructTpl *pCStack_18;
  int4 secnum_local;
  ConstructTpl *construct_local;
  PcodeBuilder *this_local;
  
  local_1c = secnum;
  pCStack_18 = construct;
  construct_local = (ConstructTpl *)this;
  if (construct != (ConstructTpl *)0x0) {
    iter._M_current._4_4_ = this->labelbase;
    this->labelbase = this->labelcount;
    uVar2 = ConstructTpl::numLabels(construct);
    this->labelcount = uVar2 + this->labelcount;
    __gnu_cxx::__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>::
    __normal_iterator((__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                       *)&op);
    local_78 = ConstructTpl::getOpvec(pCStack_18);
    local_80 = (OpTpl **)std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::begin(local_78);
    op = (OpTpl *)local_80;
    while( true ) {
      local_88._M_current = (OpTpl **)std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>::end(local_78);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                          *)&op,&local_88);
      if (!bVar1) break;
      ppOVar4 = __gnu_cxx::
                __normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>::
                operator*((__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                           *)&op);
      ops = (vector<OpTpl_*,_std::allocator<OpTpl_*>_> *)*ppOVar4;
      OVar3 = OpTpl::getOpcode((OpTpl *)ops);
      switch(OVar3) {
      case CPUI_MULTIEQUAL:
        (*this->_vptr_PcodeBuilder[3])(this,ops,(ulong)local_1c);
        break;
      case CPUI_INDIRECT:
        (*this->_vptr_PcodeBuilder[4])(this,ops);
        break;
      default:
        (**this->_vptr_PcodeBuilder)(this,ops);
        break;
      case CPUI_PTRADD:
        (*this->_vptr_PcodeBuilder[5])(this,ops);
        break;
      case CPUI_PTRSUB:
        (*this->_vptr_PcodeBuilder[6])(this,ops,(ulong)local_1c);
      }
      __gnu_cxx::__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
      ::operator++((__normal_iterator<OpTpl_*const_*,_std::vector<OpTpl_*,_std::allocator<OpTpl_*>_>_>
                    *)&op);
    }
    this->labelbase = iter._M_current._4_4_;
    return;
  }
  this_00 = (UnimplError *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  UnimplError::UnimplError(this_00,(string *)local_40,0);
  __cxa_throw(this_00,&UnimplError::typeinfo,UnimplError::~UnimplError);
}

Assistant:

void PcodeBuilder::build(ConstructTpl *construct,int4 secnum)

{
  if (construct == (ConstructTpl *)0)
    throw UnimplError("",0);	// Pcode is not implemented for this constructor

  uint4 oldbase = labelbase;	// Recursively store old labelbase
  labelbase = labelcount;	// Set the newbase
  labelcount += construct->numLabels();	// Add labels from this template

  vector<OpTpl *>::const_iterator iter;
  OpTpl *op;
  const vector<OpTpl *> &ops(construct->getOpvec());

  for(iter=ops.begin();iter!=ops.end();++iter) {
    op = *iter;
    switch(op->getOpcode()) {
    case BUILD:
      appendBuild( op, secnum );
      break;
    case DELAY_SLOT:
      delaySlot( op );
      break;
    case LABELBUILD:
      setLabel( op );
      break;
    case CROSSBUILD:
      appendCrossBuild(op,secnum);
      break;
    default:
      dump( op );
      break;
    }
  }
  labelbase = oldbase;		// Restore old labelbase
}